

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

void * mpc_export(mpc_input_t *i,void *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  
  puVar8 = (undefined8 *)p;
  if (p < i + 1 && i->mem <= p) {
    puVar8 = (undefined8 *)malloc(0x40);
    uVar1 = *(undefined8 *)((long)p + 8);
    uVar2 = *(undefined8 *)((long)p + 0x10);
    uVar3 = *(undefined8 *)((long)p + 0x18);
    uVar4 = *(undefined8 *)((long)p + 0x20);
    uVar5 = *(undefined8 *)((long)p + 0x28);
    uVar6 = *(undefined8 *)((long)p + 0x30);
    uVar7 = *(undefined8 *)((long)p + 0x38);
    *puVar8 = *p;
    puVar8[1] = uVar1;
    puVar8[2] = uVar2;
    puVar8[3] = uVar3;
    puVar8[4] = uVar4;
    puVar8[5] = uVar5;
    puVar8[6] = uVar6;
    puVar8[7] = uVar7;
    mpc_free(i,p);
  }
  return puVar8;
}

Assistant:

static void *mpc_export(mpc_input_t *i, void *p) {
  char *q = NULL;
  if (!mpc_mem_ptr(i, p)) { return p; }
  q = malloc(sizeof(mpc_mem_t));
  memcpy(q, p, sizeof(mpc_mem_t));
  mpc_free(i, p);
  return q;
}